

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

LispPTR car(LispPTR datum)

{
  uint uVar1;
  LispPTR *pLVar2;
  
  pLVar2 = NativeAligned4FromLAddr(datum);
  if ((*(ushort *)((ulong)(datum >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    uVar1 = *pLVar2;
    if (uVar1 < 0x10000000) {
      pLVar2 = NativeAligned4FromLAddr(uVar1);
      datum = *pLVar2 & 0xfffffff;
    }
    else {
      datum = uVar1 & 0xfffffff;
    }
  }
  else if (((datum != 0) && (datum != 0x4c)) && (uVar1 = datum & 0xfff0000, datum = 0, uVar1 != 0))
  {
    error("car : ARG not list");
  }
  return datum;
}

Assistant:

LispPTR car(LispPTR datum)
/* datum must be LISP pointer(word offset) */
{
  ConsCell *datum68k;
  ConsCell *temp;

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(datum));
  if (Listp(datum)) {
    if (datum68k->cdr_code == CDR_INDIRECT) {
      temp = (ConsCell *)NativeAligned4FromLAddr(datum68k->car_field);
      return ((LispPTR)temp->car_field);
    } else
      return ((LispPTR)datum68k->car_field);
  }

  else if (datum == NIL_PTR)
    return ((LispPTR)NIL_PTR);

  else {
    if (datum == ATOM_T) return (ATOM_T);

    /** We assume CAR/CDRERR is CDR ***/
    else if ((datum & SEGMASK) == 0) /* LITATOM */
      return (NIL);
    else
      error("car : ARG not list");
    return (NIL); /* NOT REACHED */
  }
}